

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_timingsafe_bcmp(void *a,void *b,uint32_t len)

{
  long lVar1;
  byte bVar2;
  uint8_t *pb;
  uint8_t *pa;
  
  if (len != 0) {
    lVar1 = 0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 | *(byte *)((long)b + lVar1) ^ *(byte *)((long)a + lVar1);
      lVar1 = lVar1 + 1;
    } while (len != (uint32_t)lVar1);
    return (int)bVar2;
  }
  return 0;
}

Assistant:

int
lws_timingsafe_bcmp(const void *a, const void *b, uint32_t len)
{
	const uint8_t *pa = a, *pb = b;
	uint8_t sum = 0;

	while (len--)
		sum |= (uint8_t)(*pa++ ^ *pb++);

	return sum;
}